

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lower.cpp
# Opt level: O1

bool __thiscall
Lowerer::GenerateFastStringLdElem
          (Lowerer *this,Instr *ldElem,LabelInstr *labelHelper,LabelInstr *labelFallThru)

{
  Opnd *this_00;
  code *pcVar1;
  OpndKind OVar2;
  bool bVar3;
  BYTE scale;
  uint32 uVar4;
  int iVar5;
  undefined4 *puVar6;
  RegOpnd *pRVar7;
  IntConstOpnd *pIVar8;
  Lowerer *dst;
  IndirOpnd *pIVar9;
  IntConstOpnd *src2;
  RegOpnd *pRVar10;
  RegOpnd *pRVar11;
  undefined4 extraout_var;
  AddrOpnd *src;
  Lowerer *pLVar12;
  undefined1 local_c8 [8];
  AutoReuseOpnd autoReuseCharOpnd;
  AutoReuseOpnd autoReuseCacheOpnd;
  AutoReuseOpnd autoReuseStringOpnd;
  AutoReuseOpnd autoReuseBufferOpnd;
  IndirOpnd *local_50;
  
  this_00 = ldElem->m_src1;
  OVar2 = IR::Opnd::GetKind(this_00);
  if (OVar2 != OpndKindIndir) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar6 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                       ,0x1c8,"(this->IsIndirOpnd())","Bad call to AsIndirOpnd()");
    if (!bVar3) goto LAB_005e9f96;
    *puVar6 = 0;
  }
  pRVar10 = (RegOpnd *)this_00[1]._vptr_Opnd;
  autoReuseStringOpnd._16_2_ = (pRVar10->super_Opnd).m_valueType.field_0.bits;
  bVar3 = ValueType::IsLikelyString((ValueType *)&autoReuseStringOpnd.autoDelete);
  if (bVar3) {
    bVar3 = IR::Opnd::IsTaggedInt((Opnd *)pRVar10);
    if (bVar3) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar6 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                         ,0x468c,"(!baseOpnd->IsTaggedInt())","!baseOpnd->IsTaggedInt()");
      if (!bVar3) goto LAB_005e9f96;
      *puVar6 = 0;
    }
    pRVar11 = *(RegOpnd **)&this_00[1].m_valueType;
    if (pRVar11 != (RegOpnd *)0x0) {
      autoReuseStringOpnd._16_2_ = (pRVar11->super_Opnd).m_valueType.field_0.bits;
      bVar3 = ValueType::IsLikelyInt((ValueType *)&autoReuseStringOpnd.autoDelete);
      if (!bVar3) goto LAB_005e9b89;
    }
    if (pRVar11 != (RegOpnd *)0x0) {
      bVar3 = IR::Opnd::IsNotInt(&pRVar11->super_Opnd);
      if (bVar3) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar6 = 1;
        bVar3 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                           ,0x4696,"(!indexOpnd || !indexOpnd->IsNotInt())",
                           "!indexOpnd || !indexOpnd->IsNotInt()");
        if (!bVar3) goto LAB_005e9f96;
        *puVar6 = 0;
      }
    }
    GenerateStringTest(this,pRVar10,ldElem,labelHelper,(LabelInstr *)0x0,true);
    pRVar7 = IR::RegOpnd::New(TyUint64,this->m_func);
    autoReuseStringOpnd.autoDelete = false;
    autoReuseStringOpnd.wasInUse = false;
    autoReuseStringOpnd._18_6_ = 0;
    IR::AutoReuseOpnd::Initialize
              ((AutoReuseOpnd *)&autoReuseStringOpnd.autoDelete,&pRVar7->super_Opnd,this->m_func,
               true);
    if (pRVar11 == (RegOpnd *)0x0) {
      local_50 = IR::IndirOpnd::New(pRVar7,*(int *)&this_00[2]._vptr_Opnd * 2,TyUint16,this->m_func,
                                    false);
      pIVar8 = IR::IntConstOpnd::New
                         ((ulong)*(uint *)&this_00[2]._vptr_Opnd,TyUint32,this->m_func,false);
    }
    else {
      pIVar8 = (IntConstOpnd *)GenerateUntagVar(this,pRVar11,labelHelper,ldElem,true);
      local_50 = IR::IndirOpnd::New(pRVar7,(RegOpnd *)pIVar8,'\x01',TyUint16,this->m_func);
    }
    dst = (Lowerer *)IR::RegOpnd::New(TyUint32,this->m_func);
    pIVar9 = IR::IndirOpnd::New(pRVar10,0x18,TyUint32,this->m_func,false);
    pLVar12 = dst;
    InsertMove((Opnd *)dst,&pIVar9->super_Opnd,ldElem,true);
    InsertCompareBranch(pLVar12,(Opnd *)dst,&pIVar8->super_Opnd,BrLe_A,true,labelHelper,ldElem,false
                       );
    pIVar9 = IR::IndirOpnd::New(pRVar10,0x10,TyUint64,this->m_func,false);
    InsertMove(&pRVar7->super_Opnd,&pIVar9->super_Opnd,ldElem,true);
    InsertTest(&pRVar7->super_Opnd,&pRVar7->super_Opnd,ldElem);
    InsertBranch(BrEq_A,false,labelHelper,ldElem);
    if (DAT_015bbdbf == '\x01') {
      OVar2 = IR::Opnd::GetKind(&pIVar8->super_Opnd);
      if (OVar2 == OpndKindIntConst) {
        OVar2 = IR::Opnd::GetKind(&pIVar8->super_Opnd);
        if (OVar2 != OpndKindIntConst) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
          *puVar6 = 1;
          bVar3 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                             ,0xc0,"(this->IsIntConstOpnd())","Bad call to AsIntConstOpnd()");
          if (!bVar3) {
LAB_005e9f96:
            pcVar1 = (code *)invalidInstructionException();
            (*pcVar1)();
          }
          *puVar6 = 0;
        }
        uVar4 = IR::IntConstOpnd::AsUint32(pIVar8);
        local_50->m_offset = uVar4 * 2;
        (local_50->super_Opnd).field_0xe = 0;
      }
      else {
        src2 = IR::IntConstOpnd::New(0x7fffffff,TyInt32,this->m_func,false);
        InsertAnd(&pIVar8->super_Opnd,&pIVar8->super_Opnd,&src2->super_Opnd,ldElem);
      }
      pRVar10 = IR::RegOpnd::New(TyInt32,this->m_func);
      InsertSub(false,&pRVar10->super_Opnd,&pIVar8->super_Opnd,(Opnd *)dst,ldElem);
      pIVar8 = IR::IntConstOpnd::New(0x1f,TyInt8,this->m_func,false);
      InsertShift(Shr_A,false,&pRVar10->super_Opnd,&pRVar10->super_Opnd,&pIVar8->super_Opnd,ldElem);
    }
    else {
      pRVar10 = (RegOpnd *)0x0;
    }
    pRVar11 = IR::RegOpnd::New(TyUint32,this->m_func);
    local_c8 = (undefined1  [8])0x0;
    IR::AutoReuseOpnd::Initialize((AutoReuseOpnd *)local_c8,&pRVar11->super_Opnd,this->m_func,true);
    InsertMove(&pRVar11->super_Opnd,&local_50->super_Opnd,ldElem,true);
    if (DAT_015bbdbf == '\x01') {
      InsertAnd(&pRVar11->super_Opnd,&pRVar11->super_Opnd,&pRVar10->super_Opnd,ldElem);
    }
    pLVar12 = (Lowerer *)&DAT_00000080;
    pIVar8 = IR::IntConstOpnd::New(0x80,TyUint16,this->m_func,false);
    InsertCompareBranch(pLVar12,&pRVar11->super_Opnd,&pIVar8->super_Opnd,BrGe_A,true,labelHelper,
                        ldElem,false);
    pRVar10 = IR::RegOpnd::New(TyUint64,this->m_func);
    autoReuseCharOpnd.autoDelete = false;
    autoReuseCharOpnd.wasInUse = false;
    autoReuseCharOpnd._18_6_ = 0;
    IR::AutoReuseOpnd::Initialize
              ((AutoReuseOpnd *)&autoReuseCharOpnd.autoDelete,&pRVar10->super_Opnd,this->m_func,true
              );
    iVar5 = (*ldElem->m_func->m_scriptContextInfo->_vptr_ScriptContextInfo[0x11])();
    src = IR::AddrOpnd::New(CONCAT44(extraout_var,iVar5),AddrOpndKindDynamicCharStringCache,
                            ldElem->m_func,false,(Var)0x0);
    InsertMove(&pRVar10->super_Opnd,&src->super_Opnd,ldElem,true);
    pRVar7 = IR::RegOpnd::New(TyUint64,this->m_func);
    autoReuseCacheOpnd.autoDelete = false;
    autoReuseCacheOpnd.wasInUse = false;
    autoReuseCacheOpnd._18_6_ = 0;
    IR::AutoReuseOpnd::Initialize
              ((AutoReuseOpnd *)&autoReuseCacheOpnd.autoDelete,&pRVar7->super_Opnd,this->m_func,true
              );
    scale = LowererMDArch::GetDefaultIndirScale();
    pIVar9 = IR::IndirOpnd::New(pRVar10,pRVar11,scale,TyVar,this->m_func);
    InsertMove(&pRVar7->super_Opnd,&pIVar9->super_Opnd,ldElem,true);
    InsertTest(&pRVar7->super_Opnd,&pRVar7->super_Opnd,ldElem);
    InsertBranch(BrEq_A,false,labelHelper,ldElem);
    InsertMove(ldElem->m_dst,&pRVar7->super_Opnd,ldElem,true);
    InsertBranch(Br,false,labelFallThru,ldElem);
    IR::AutoReuseOpnd::~AutoReuseOpnd((AutoReuseOpnd *)&autoReuseCacheOpnd.autoDelete);
    IR::AutoReuseOpnd::~AutoReuseOpnd((AutoReuseOpnd *)&autoReuseCharOpnd.autoDelete);
    IR::AutoReuseOpnd::~AutoReuseOpnd((AutoReuseOpnd *)local_c8);
    IR::AutoReuseOpnd::~AutoReuseOpnd((AutoReuseOpnd *)&autoReuseStringOpnd.autoDelete);
    bVar3 = true;
  }
  else {
LAB_005e9b89:
    bVar3 = false;
  }
  return bVar3;
}

Assistant:

bool
Lowerer::GenerateFastStringLdElem(IR::Instr * ldElem, IR::LabelInstr * labelHelper, IR::LabelInstr * labelFallThru)
{
    IR::IndirOpnd * indirOpnd = ldElem->GetSrc1()->AsIndirOpnd();
    IR::RegOpnd * baseOpnd = indirOpnd->GetBaseOpnd();

    // don't generate the fast path if the instance is not likely string
    if (!baseOpnd->GetValueType().IsLikelyString())
    {
        return false;
    }

    Assert(!baseOpnd->IsTaggedInt());

    IR::RegOpnd * indexOpnd = indirOpnd->GetIndexOpnd();
    // Don't generate the fast path if the index operand is not likely int
    if (indexOpnd && !indexOpnd->GetValueType().IsLikelyInt())
    {
        return false;
    }

    // Make sure the instance is a string
    Assert(!indexOpnd || !indexOpnd->IsNotInt());
    GenerateStringTest(baseOpnd, ldElem, labelHelper);

    IR::Opnd * index32CmpOpnd;
    IR::RegOpnd * bufferOpnd = IR::RegOpnd::New(TyMachPtr, this->m_func);
    const IR::AutoReuseOpnd autoReuseBufferOpnd(bufferOpnd, m_func);
    IR::IndirOpnd * charIndirOpnd;
    if (indexOpnd)
    {
        // Untag the var and generate the indir into the string buffer
        IR::RegOpnd * index32Opnd = GenerateUntagVar(indexOpnd, labelHelper, ldElem);
        charIndirOpnd = IR::IndirOpnd::New(bufferOpnd, index32Opnd, 1, TyUint16, this->m_func);
        index32CmpOpnd = index32Opnd;
    }
    else
    {
        // Just use the offset to indirect into the string buffer
        charIndirOpnd = IR::IndirOpnd::New(bufferOpnd, indirOpnd->GetOffset() * sizeof(char16), TyUint16, this->m_func);
        index32CmpOpnd = IR::IntConstOpnd::New((uint32)indirOpnd->GetOffset(), TyUint32, this->m_func);
    }

    // Check if the index is in range of the string length
    //  CMP [baseOpnd + offset(length)], indexOpnd     --  string length
    //  JBE $helper                                    -- unsigned compare, and string length are at most INT_MAX - 1
    //                                                 -- so that even if we have a negative index, this will fail
    IR::RegOpnd* lengthOpnd = IR::RegOpnd::New(TyUint32, m_func);
    InsertMove(lengthOpnd, IR::IndirOpnd::New(baseOpnd, offsetof(Js::JavascriptString, m_charLength), TyUint32, this->m_func), ldElem);
    InsertCompareBranch(lengthOpnd, index32CmpOpnd, Js::OpCode::BrLe_A, true, labelHelper, ldElem);

    // Load the string buffer and make sure it is not null
    //  MOV bufferOpnd, [baseOpnd + offset(m_pszValue)]
    //  TEST bufferOpnd, bufferOpnd
    //  JEQ $labelHelper
    indirOpnd = IR::IndirOpnd::New(baseOpnd, offsetof(Js::JavascriptString, m_pszValue), TyMachPtr, this->m_func);

    InsertMove(bufferOpnd, indirOpnd, ldElem);
    GenerateNotZeroTest(bufferOpnd, labelHelper, ldElem);

    IR::RegOpnd* maskOpnd = nullptr;
    if (CONFIG_FLAG_RELEASE(PoisonStringLoad))
    {
        // Mask off the sign before loading so that poisoning will work for negative indices
        if (index32CmpOpnd->IsIntConstOpnd())
        {
            charIndirOpnd->SetOffset((index32CmpOpnd->AsIntConstOpnd()->AsUint32() & INT32_MAX) * sizeof(char16));
        }
        else
        {
            InsertAnd(index32CmpOpnd, index32CmpOpnd, IR::IntConstOpnd::New(INT32_MAX, TyInt32, m_func), ldElem);
        }

        // All bits in mask will be 1 for a valid index or 0 for an OOB index
        maskOpnd = IR::RegOpnd::New(TyInt32, m_func);
        InsertSub(false, maskOpnd, index32CmpOpnd, lengthOpnd, ldElem);
        InsertShift(Js::OpCode::Shr_A, false, maskOpnd, maskOpnd, IR::IntConstOpnd::New(31, TyInt8, m_func), ldElem);
    }

    // Load the character and check if it is 7bit ASCI (which we have the cache for)
    //  MOV charOpnd, [bufferOpnd + index32Opnd]
    //  CMP charOpnd, 0x80
    //  JAE $helper
    IR::RegOpnd * charOpnd = IR::RegOpnd::New(TyUint32, this->m_func);
    const IR::AutoReuseOpnd autoReuseCharOpnd(charOpnd, m_func);
    InsertMove(charOpnd, charIndirOpnd, ldElem);

    if (CONFIG_FLAG_RELEASE(PoisonStringLoad))
    {
        InsertAnd(charOpnd, charOpnd, maskOpnd, ldElem);
    }

    InsertCompareBranch(charOpnd, IR::IntConstOpnd::New(Js::CharStringCache::CharStringCacheSize, TyUint16, this->m_func),
        Js::OpCode::BrGe_A, true, labelHelper, ldElem);

    // Load the string from the cache
    //  MOV charStringCache, <charStringCache, address>
    //  MOV stringOpnd, [charStringCache + charOpnd * 4]

    IR::RegOpnd * cacheOpnd = IR::RegOpnd::New(TyMachPtr, this->m_func);
    const IR::AutoReuseOpnd autoReuseCacheOpnd(cacheOpnd, m_func);
    Assert(Js::JavascriptLibrary::GetCharStringCacheAOffset() == Js::JavascriptLibrary::GetCharStringCacheOffset());
    InsertMove(cacheOpnd, this->LoadLibraryValueOpnd(ldElem,  LibraryValue::ValueCharStringCache), ldElem);

    // Check if we have created the string or not
    //  TEST stringOpnd, stringOpnd
    //  JE $helper
    IR::RegOpnd * stringOpnd =  IR::RegOpnd::New(TyMachPtr, this->m_func);
    const IR::AutoReuseOpnd autoReuseStringOpnd(stringOpnd, m_func);
    InsertMove(stringOpnd, IR::IndirOpnd::New(cacheOpnd, charOpnd, this->m_lowererMD.GetDefaultIndirScale(), TyVar, this->m_func), ldElem);

    GenerateNotZeroTest(stringOpnd, labelHelper, ldElem);

    InsertMove(ldElem->GetDst(), stringOpnd, ldElem);
    InsertBranch(Js::OpCode::Br, labelFallThru, ldElem);

    return true;
}